

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.h
# Opt level: O0

void __thiscall
btTranslationalLimitMotor::btTranslationalLimitMotor(btTranslationalLimitMotor *this)

{
  btScalar *pbVar1;
  btVector3 *in_RDI;
  int i;
  int local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btScalar local_18;
  btScalar local_14;
  btScalar local_10;
  btScalar local_c [3];
  
  btVector3::btVector3(in_RDI);
  btVector3::btVector3(in_RDI + 1);
  btVector3::btVector3(in_RDI + 2);
  btVector3::btVector3((btVector3 *)(in_RDI[3].m_floats + 3));
  btVector3::btVector3((btVector3 *)(in_RDI[4].m_floats + 3));
  btVector3::btVector3((btVector3 *)(in_RDI[5].m_floats + 3));
  btVector3::btVector3(in_RDI + 7);
  btVector3::btVector3(in_RDI + 8);
  btVector3::btVector3(in_RDI + 9);
  btVector3::btVector3(in_RDI + 10);
  local_c[0] = 0.0;
  local_10 = 0.0;
  local_14 = 0.0;
  btVector3::setValue(in_RDI,local_c,&local_10,&local_14);
  local_18 = 0.0;
  local_1c = 0.0;
  local_20 = 0.0;
  btVector3::setValue(in_RDI + 1,&local_18,&local_1c,&local_20);
  local_24 = 0.0;
  local_28 = 0.0;
  local_2c = 0.0;
  btVector3::setValue(in_RDI + 2,&local_24,&local_28,&local_2c);
  local_30 = 0.0;
  local_34 = 0.0;
  local_38 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[3].m_floats + 3),&local_30,&local_34,&local_38);
  local_3c = 0.2;
  local_40 = 0.2;
  local_44 = 0.2;
  btVector3::setValue((btVector3 *)(in_RDI[4].m_floats + 3),&local_3c,&local_40,&local_44);
  local_48 = 0.0;
  local_4c = 0.0;
  local_50 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[5].m_floats + 3),&local_48,&local_4c,&local_50);
  in_RDI[3].m_floats[0] = 0.7;
  in_RDI[3].m_floats[1] = 1.0;
  in_RDI[3].m_floats[2] = 0.5;
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    *(undefined1 *)((long)in_RDI[6].m_floats + (long)local_54 + 0xc) = 0;
    pbVar1 = btVector3::operator_cast_to_float_(in_RDI + 7);
    pbVar1[local_54] = 0.0;
    pbVar1 = btVector3::operator_cast_to_float_(in_RDI + 8);
    pbVar1[local_54] = 0.0;
  }
  return;
}

Assistant:

btTranslationalLimitMotor()
    {
    	m_lowerLimit.setValue(0.f,0.f,0.f);
    	m_upperLimit.setValue(0.f,0.f,0.f);
    	m_accumulatedImpulse.setValue(0.f,0.f,0.f);
		m_normalCFM.setValue(0.f, 0.f, 0.f);
		m_stopERP.setValue(0.2f, 0.2f, 0.2f);
		m_stopCFM.setValue(0.f, 0.f, 0.f);

    	m_limitSoftness = 0.7f;
    	m_damping = btScalar(1.0f);
    	m_restitution = btScalar(0.5f);
		for(int i=0; i < 3; i++) 
		{
			m_enableMotor[i] = false;
			m_targetVelocity[i] = btScalar(0.f);
			m_maxMotorForce[i] = btScalar(0.f);
		}
    }